

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalRestart(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3Phrase *pPhrase;
  Fts3MultiSegReader *pFVar1;
  Fts3SegReader **ppFVar2;
  Fts3SegReader *pFVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  while ((pExpr != (Fts3Expr *)0x0 && (*pRc == 0))) {
    pPhrase = pExpr->pPhrase;
    if (pPhrase != (Fts3Phrase *)0x0) {
      fts3EvalInvalidatePoslist(pPhrase);
      if (pPhrase->bIncr != 0) {
        uVar5 = (ulong)(uint)pPhrase->nToken;
        if (pPhrase->nToken < 1) {
          uVar5 = 0;
        }
        for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          pFVar1 = pPhrase->aToken[uVar6].pSegcsr;
          if (pFVar1 != (Fts3MultiSegReader *)0x0) {
            pFVar1->nAdvance = 0;
            pFVar1->bRestart = 1;
            uVar7 = (ulong)(uint)pFVar1->nSegment;
            if (pFVar1->nSegment < 1) {
              uVar7 = 0;
            }
            for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
              ppFVar2 = pFVar1->apSegment;
              ppFVar2[uVar8]->pOffsetList = (char *)0x0;
              pFVar3 = ppFVar2[uVar8];
              pFVar3->nOffsetList = 0;
              pFVar3->iDocid = 0;
            }
          }
        }
        iVar4 = fts3EvalPhraseStart(pCsr,0,pPhrase);
        *pRc = iVar4;
      }
      pPhrase->pOrPoslist = (char *)0x0;
      (pPhrase->doclist).pNextDocid = (char *)0x0;
      (pPhrase->doclist).iDocid = 0;
    }
    pExpr->iDocid = 0;
    pExpr->bEof = '\0';
    pExpr->bStart = '\0';
    fts3EvalRestart(pCsr,pExpr->pLeft,pRc);
    pExpr = pExpr->pRight;
  }
  return;
}

Assistant:

static void fts3EvalRestart(
  Fts3Cursor *pCsr,
  Fts3Expr *pExpr,
  int *pRc
){
  if( pExpr && *pRc==SQLITE_OK ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;

    if( pPhrase ){
      fts3EvalInvalidatePoslist(pPhrase);
      if( pPhrase->bIncr ){
        int i;
        for(i=0; i<pPhrase->nToken; i++){
          Fts3PhraseToken *pToken = &pPhrase->aToken[i];
          assert( pToken->pDeferred==0 );
          if( pToken->pSegcsr ){
            sqlite3Fts3MsrIncrRestart(pToken->pSegcsr);
          }
        }
        *pRc = fts3EvalPhraseStart(pCsr, 0, pPhrase);
      }
      pPhrase->doclist.pNextDocid = 0;
      pPhrase->doclist.iDocid = 0;
      pPhrase->pOrPoslist = 0;
    }

    pExpr->iDocid = 0;
    pExpr->bEof = 0;
    pExpr->bStart = 0;

    fts3EvalRestart(pCsr, pExpr->pLeft, pRc);
    fts3EvalRestart(pCsr, pExpr->pRight, pRc);
  }
}